

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void CServer::ConKick(IResult *pResult,void *pUser)

{
  int iVar1;
  undefined4 extraout_var;
  long *in_RSI;
  IResult *in_RDI;
  long in_FS_OFFSET;
  char aBuf [128];
  char local_88 [128];
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = IConsole::IResult::NumArguments(in_RDI);
  if (iVar1 < 2) {
    iVar1 = (*in_RDI->_vptr_IResult[2])(in_RDI,0);
    (**(code **)(*in_RSI + 0xa8))(in_RSI,iVar1,"Kicked by console");
  }
  else {
    iVar1 = (*in_RDI->_vptr_IResult[4])(in_RDI,1);
    str_format(local_88,0x80,"Kicked (%s)",CONCAT44(extraout_var,iVar1));
    iVar1 = (*in_RDI->_vptr_IResult[2])(in_RDI,0);
    (**(code **)(*in_RSI + 0xa8))(in_RSI,iVar1,local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServer::ConKick(IConsole::IResult *pResult, void *pUser)
{
	if(pResult->NumArguments() > 1)
	{
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), "Kicked (%s)", pResult->GetString(1));
		((CServer *)pUser)->Kick(pResult->GetInteger(0), aBuf);
	}
	else
		((CServer *)pUser)->Kick(pResult->GetInteger(0), "Kicked by console");
}